

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O0

void do_transpose(j_decompress_ptr srcinfo,j_compress_ptr dstinfo,JDIMENSION x_crop_offset,
                 JDIMENSION y_crop_offset,jvirt_barray_ptr *src_coef_arrays,
                 jvirt_barray_ptr *dst_coef_arrays)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  jpeg_component_info *compptr;
  JCOEFPTR dst_ptr;
  JCOEFPTR src_ptr;
  JBLOCKARRAY dst_buffer;
  JBLOCKARRAY src_buffer;
  int offset_y;
  int offset_x;
  int j;
  int i;
  int ci;
  JDIMENSION y_crop_blocks;
  JDIMENSION x_crop_blocks;
  JDIMENSION dst_blk_y;
  JDIMENSION dst_blk_x;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_30;
  undefined4 local_2c;
  
  for (local_3c = 0; local_3c < *(int *)(in_RSI + 0x4c); local_3c = local_3c + 1) {
    lVar5 = *(long *)(in_RSI + 0x58) + (long)local_3c * 0x60;
    iVar1 = *(int *)(lVar5 + 8);
    iVar2 = *(int *)(lVar5 + 0xc);
    for (local_30 = 0; local_30 < *(uint *)(lVar5 + 0x20);
        local_30 = *(int *)(lVar5 + 0xc) + local_30) {
      lVar6 = (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                        (in_RDI,*(undefined8 *)(in_R9 + (long)local_3c * 8),local_30,
                         *(undefined4 *)(lVar5 + 0xc),1);
      for (local_4c = 0; local_4c < *(int *)(lVar5 + 0xc); local_4c = local_4c + 1) {
        for (local_2c = 0; local_2c < *(uint *)(lVar5 + 0x1c);
            local_2c = *(int *)(lVar5 + 8) + local_2c) {
          lVar7 = (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                            (in_RDI,*(undefined8 *)(in_R8 + (long)local_3c * 8),
                             local_2c + in_EDX * iVar1,*(undefined4 *)(lVar5 + 8),0);
          for (local_48 = 0; local_48 < *(int *)(lVar5 + 8); local_48 = local_48 + 1) {
            lVar3 = *(long *)(lVar6 + (long)local_4c * 8);
            lVar4 = *(long *)(lVar7 + (long)local_48 * 8);
            for (local_40 = 0; local_40 < 8; local_40 = local_40 + 1) {
              for (local_44 = 0; local_44 < 8; local_44 = local_44 + 1) {
                *(undefined2 *)
                 (lVar3 + (ulong)(local_2c + local_48) * 0x80 + (long)(local_44 * 8 + local_40) * 2)
                     = *(undefined2 *)
                        (lVar4 + (ulong)(local_30 + local_4c + in_ECX * iVar2) * 0x80 +
                        (long)(local_40 * 8 + local_44) * 2);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

LOCAL(void)
do_transpose(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
             JDIMENSION x_crop_offset, JDIMENSION y_crop_offset,
             jvirt_barray_ptr *src_coef_arrays,
             jvirt_barray_ptr *dst_coef_arrays)
/* Transpose source into destination */
{
  JDIMENSION dst_blk_x, dst_blk_y, x_crop_blocks, y_crop_blocks;
  int ci, i, j, offset_x, offset_y;
  JBLOCKARRAY src_buffer, dst_buffer;
  JCOEFPTR src_ptr, dst_ptr;
  jpeg_component_info *compptr;

  /* Transposing pixels within a block just requires transposing the
   * DCT coefficients.
   * Partial iMCUs at the edges require no special treatment; we simply
   * process all the available DCT blocks for every component.
   */
  for (ci = 0; ci < dstinfo->num_components; ci++) {
    compptr = dstinfo->comp_info + ci;
    x_crop_blocks = x_crop_offset * compptr->h_samp_factor;
    y_crop_blocks = y_crop_offset * compptr->v_samp_factor;
    for (dst_blk_y = 0; dst_blk_y < compptr->height_in_blocks;
         dst_blk_y += compptr->v_samp_factor) {
      dst_buffer = (*srcinfo->mem->access_virt_barray)
        ((j_common_ptr)srcinfo, dst_coef_arrays[ci], dst_blk_y,
         (JDIMENSION)compptr->v_samp_factor, TRUE);
      for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
        for (dst_blk_x = 0; dst_blk_x < compptr->width_in_blocks;
             dst_blk_x += compptr->h_samp_factor) {
          src_buffer = (*srcinfo->mem->access_virt_barray)
            ((j_common_ptr)srcinfo, src_coef_arrays[ci],
             dst_blk_x + x_crop_blocks,
             (JDIMENSION)compptr->h_samp_factor, FALSE);
          for (offset_x = 0; offset_x < compptr->h_samp_factor; offset_x++) {
            dst_ptr = dst_buffer[offset_y][dst_blk_x + offset_x];
            src_ptr =
              src_buffer[offset_x][dst_blk_y + offset_y + y_crop_blocks];
            for (i = 0; i < DCTSIZE; i++)
              for (j = 0; j < DCTSIZE; j++)
                dst_ptr[j * DCTSIZE + i] = src_ptr[i * DCTSIZE + j];
          }
        }
      }
    }
  }
}